

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  wchar_t wVar6;
  long lVar7;
  char cVar8;
  char *p;
  char *pcVar9;
  bool bVar10;
  mbstate_t_conflict shift_state;
  wchar_t local_34;
  mbstate_t local_30;
  
  if (sc->same == L'\0') {
    paVar1 = archive_string_ensure(as,length + as->length + 1);
    wVar6 = L'\xffffffff';
    if (paVar1 != (archive_string *)0x0) {
      pcVar3 = as->s + as->length;
      cVar8 = *_p;
      wVar6 = L'\0';
      if (length != 0 && cVar8 != '\0') {
        uVar5 = ~as->length + as->buffer_length;
        pcVar9 = (char *)((long)_p + 1);
        wVar6 = L'\0';
        lVar7 = length + 3;
        do {
          if (cVar8 < '\0') {
            if ((sc->flag & L'Ā') == L'\0') {
              if (-1 < cVar8) goto LAB_005007d2;
              *pcVar3 = '?';
              pcVar3 = pcVar3 + 1;
            }
            else {
              if (uVar5 < 3) {
                as->length = (long)pcVar3 - (long)as->s;
                paVar1 = archive_string_ensure(as,as->buffer_length + lVar7);
                if (paVar1 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar3 = as->s + as->length;
                uVar5 = ~as->length + as->buffer_length;
              }
              pcVar3[0] = -0x11;
              pcVar3[1] = -0x41;
              pcVar3[2] = -0x43;
              pcVar3 = pcVar3 + 3;
              uVar5 = uVar5 - 3;
            }
            wVar6 = L'\xffffffff';
          }
          else {
LAB_005007d2:
            *pcVar3 = cVar8;
            pcVar3 = pcVar3 + 1;
          }
          cVar8 = *pcVar9;
          if (cVar8 == '\0') break;
          pcVar9 = pcVar9 + 1;
          bVar10 = lVar7 != 4;
          lVar7 = lVar7 + -1;
        } while (bVar10);
      }
      as->length = (long)pcVar3 - (long)as->s;
      *pcVar3 = '\0';
    }
  }
  else {
    paVar1 = archive_string_append(as,(char *)_p,length);
    if (paVar1 != (archive_string *)0x0) {
      local_30.__count = 0;
      local_30.__value = (_union_27)0x0;
      do {
        if (length == 0) {
          return L'\0';
        }
        sVar2 = mbrtowc(&local_34,(char *)_p,length,&local_30);
        iVar4 = 1;
        if (sVar2 < 0xfffffffffffffffe) {
          if (sVar2 == 0) {
            iVar4 = 3;
          }
          else {
            _p = (void *)((long)_p + sVar2);
            length = length - sVar2;
            iVar4 = 0;
          }
        }
      } while (iVar4 == 0);
      if (iVar4 == 3) {
        return L'\0';
      }
    }
    wVar6 = L'\xffffffff';
  }
  return wVar6;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	char *otp;
	const uint8_t *itp;
	size_t avail;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */
	if (archive_string_ensure(as, as->length + length + 1) == NULL)
		return (-1);

	remaining = length;
	itp = (const uint8_t *)_p;
	otp = as->s + as->length;
	avail = as->buffer_length - as->length -1;
	while (*itp && remaining > 0) {
		if (*itp > 127 && (sc->flag & SCONV_TO_UTF8)) {
			if (avail < UTF8_R_CHAR_SIZE) {
				as->length = otp - as->s;
				if (NULL == archive_string_ensure(as,
				    as->buffer_length + remaining +
				    UTF8_R_CHAR_SIZE))
					return (-1);
				otp = as->s + as->length;
				avail = as->buffer_length - as->length -1;
			}
			/*
		 	 * When coping a string in UTF-8, unknown character
			 * should be U+FFFD (replacement character).
			 */
			UTF8_SET_R_CHAR(otp);
			otp += UTF8_R_CHAR_SIZE;
			avail -= UTF8_R_CHAR_SIZE;
			itp++;
			remaining--;
			return_value = -1;
		} else if (*itp > 127) {
			*otp++ = '?';
			itp++;
			remaining--;
			return_value = -1;
		} else {
			*otp++ = (char)*itp++;
			remaining--;
		}
	}
	as->length = otp - as->s;
	as->s[as->length] = '\0';
	return (return_value);
}